

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutCut.c
# Opt level: O3

Cut_Cut_t * Cut_CutDupList(Cut_Man_t *p,Cut_Cut_t *pList)

{
  char *__dest;
  Cut_Cut_t **ppCVar1;
  Cut_Cut_t *pHead;
  Cut_Cut_t *local_28;
  
  ppCVar1 = &local_28;
  local_28 = (Cut_Cut_t *)0x0;
  if (pList == (Cut_Cut_t *)0x0) {
    local_28 = (Cut_Cut_t *)0x0;
  }
  else {
    do {
      __dest = Extra_MmFixedEntryFetch(p->pMmCuts);
      memcpy(__dest,pList,(long)p->EntrySize);
      *ppCVar1 = (Cut_Cut_t *)__dest;
      ppCVar1 = (Cut_Cut_t **)(__dest + 0x10);
      pList = pList->pNext;
    } while (pList != (Cut_Cut_t *)0x0);
    *(char *)((long)ppCVar1 + 0) = '\0';
    *(char *)((long)ppCVar1 + 1) = '\0';
    *(char *)((long)ppCVar1 + 2) = '\0';
    *(char *)((long)ppCVar1 + 3) = '\0';
    *(char *)((long)ppCVar1 + 4) = '\0';
    *(char *)((long)ppCVar1 + 5) = '\0';
    *(char *)((long)ppCVar1 + 6) = '\0';
    *(char *)((long)ppCVar1 + 7) = '\0';
  }
  return local_28;
}

Assistant:

Cut_Cut_t * Cut_CutDupList( Cut_Man_t * p, Cut_Cut_t * pList )
{
    Cut_Cut_t * pHead = NULL, ** ppTail = &pHead;
    Cut_Cut_t * pTemp, * pCopy;
    if ( pList == NULL )
        return NULL;
    Cut_ListForEachCut( pList, pTemp )
    {
        pCopy = (Cut_Cut_t *)Extra_MmFixedEntryFetch( p->pMmCuts );
        memcpy( pCopy, pTemp, (size_t)p->EntrySize );
        *ppTail = pCopy;
        ppTail = &pCopy->pNext;
    }
    *ppTail = NULL;
    return pHead;
}